

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassTemplate.h
# Opt level: O0

void __thiscall
kiste::ClassTemplate_t<kiste::terminal_t,kiste::parse_context,kiste::cpp>::
render_member<kiste::class_t,kiste::member_t>
          (ClassTemplate_t<kiste::terminal_t,kiste::parse_context,kiste::cpp> *this,size_t line_no,
          class_t *class_data,member_t *member)

{
  ulong uVar1;
  undefined1 local_80 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> class_alias;
  size_t ns_pos;
  string unqualified_class_name;
  member_t *member_local;
  class_t *class_data_local;
  size_t line_no_local;
  ClassTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> *this_local;
  
  unqualified_class_name.field_2._8_8_ = member;
  std::__cxx11::string::string((string *)&ns_pos,(string *)member);
  while (uVar1 = std::__cxx11::string::find((char *)&ns_pos,0x11288d), uVar1 != 0xffffffffffffffff)
  {
    if (uVar1 == 0) {
      std::__cxx11::string::replace((ulong)&ns_pos,0,(char *)0x2);
    }
    else {
      std::__cxx11::string::replace((ulong)&ns_pos,uVar1,(char *)0x2);
    }
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ns_pos,
                 "_t_alias");
  cpp::text(*(cpp **)(this + 0x10),"using ");
  cpp::
  escape<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            (*(cpp **)(this + 0x10),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
  cpp::text(*(cpp **)(this + 0x10)," = ");
  cpp::
  escape<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            (*(cpp **)(this + 0x10),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             unqualified_class_name.field_2._8_8_);
  cpp::text(*(cpp **)(this + 0x10),"_t<");
  cpp::
  escape<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            (*(cpp **)(this + 0x10),&class_data->_name);
  cpp::text(*(cpp **)(this + 0x10),"_t, _data_t, _serializer_t>;");
  cpp::
  escape<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            (*(cpp **)(this + 0x10),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
  cpp::text(*(cpp **)(this + 0x10)," ");
  cpp::
  escape<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            (*(cpp **)(this + 0x10),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (unqualified_class_name.field_2._8_8_ + 0x20));
  cpp::text(*(cpp **)(this + 0x10)," = ");
  cpp::
  escape<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            (*(cpp **)(this + 0x10),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
  cpp::text(*(cpp **)(this + 0x10),"{*this, data, _serialize};\n");
  ClassTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp>::line_directive
            ((ClassTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> *)this,
             line_no + 1);
  cpp::text(*(cpp **)(this + 0x10),"\n");
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)&ns_pos);
  return;
}

Assistant:

void render_member(const size_t line_no, const ClassData& class_data, const Member& member)
    {
      // The "using" is required for clang-3.1 and older g++ versions.
      // Replace any namespace qualification by underscores for use in the alias type name.
      auto unqualified_class_name = member.class_name;
      {
        size_t ns_pos;
        while ((ns_pos = unqualified_class_name.find("::")) != std::string::npos)
          if (ns_pos == 0)
            unqualified_class_name.replace(ns_pos, 2, "");
          else
            unqualified_class_name.replace(ns_pos, 2, "_");
      }
      auto class_alias = unqualified_class_name + "_t_alias";
    _serialize.text("using ");_serialize.escape(class_alias);_serialize.text(" = ");_serialize.escape(member.class_name);_serialize.text("_t<");_serialize.escape(class_data._name);_serialize.text("_t, _data_t, _serializer_t>;");
    _serialize.escape(class_alias);_serialize.text(" ");_serialize.escape(member.name);_serialize.text(" = ");_serialize.escape(class_alias);_serialize.text("{*this, data, _serialize};\n");
    static_assert(std::is_same<decltype(line_directive(line_no + 1)), void>::value, "$call{} requires void expression"); (line_directive(line_no + 1));_serialize.text("\n");
    }